

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall
Args::HelpHasBeenPrintedException::HelpHasBeenPrintedException(HelpHasBeenPrintedException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_30;
  size_type local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  local_30 = &local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Help has been printed.","");
  std::logic_error::logic_error((logic_error *)this,"Please use desc() method of the exception.");
  *(undefined ***)&this->super_BaseException = &PTR__BaseException_00158a10;
  paVar1 = &(this->super_BaseException).m_what.field_2;
  (this->super_BaseException).m_what._M_dataplus._M_p = (pointer)paVar1;
  if (local_30 == &local_20) {
    paVar1->_M_allocated_capacity = local_20;
    *(undefined8 *)((long)&(this->super_BaseException).m_what.field_2 + 8) = uStack_18;
  }
  else {
    (this->super_BaseException).m_what._M_dataplus._M_p = (pointer)local_30;
    (this->super_BaseException).m_what.field_2._M_allocated_capacity = local_20;
  }
  (this->super_BaseException).m_what._M_string_length = local_28;
  *(undefined ***)&this->super_BaseException = &PTR__BaseException_001589e8;
  return;
}

Assistant:

HelpHasBeenPrintedException()
		:	BaseException( SL( "Help has been printed." ) )
	{
	}